

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O1

int X509_add1_reject_object(X509 *x,ASN1_OBJECT *obj)

{
  stack_st_GENERAL_NAME *psVar1;
  ASN1_OBJECT *a;
  ASN1_VALUE *pAVar2;
  OPENSSL_STACK *pOVar3;
  size_t sVar4;
  bool bVar5;
  
  a = OBJ_dup(obj);
  if (a == (ASN1_OBJECT *)0x0) {
LAB_004bd679:
    bVar5 = false;
  }
  else {
    if (x->altname == (stack_st_GENERAL_NAME *)0x0) {
      pAVar2 = ASN1_item_new((ASN1_ITEM *)&X509_CERT_AUX_it);
      x->altname = (stack_st_GENERAL_NAME *)pAVar2;
    }
    psVar1 = x->altname;
    if ((psVar1->stack).data == (char **)0x0) {
      pOVar3 = OPENSSL_sk_new_null();
      (psVar1->stack).data = (char **)pOVar3;
      if (pOVar3 == (OPENSSL_STACK *)0x0) goto LAB_004bd679;
    }
    sVar4 = OPENSSL_sk_push((OPENSSL_STACK *)(psVar1->stack).data,a);
    bVar5 = sVar4 != 0;
    if (!bVar5) {
      ASN1_OBJECT_free(a);
    }
    a = (ASN1_OBJECT *)0x0;
  }
  if (a != (ASN1_OBJECT *)0x0) {
    ASN1_OBJECT_free(a);
  }
  return (int)bVar5;
}

Assistant:

int X509_add1_reject_object(X509 *x, const ASN1_OBJECT *obj) {
  bssl::UniquePtr<ASN1_OBJECT> objtmp(OBJ_dup(obj));
  if (objtmp == nullptr) {
    return 0;
  }
  X509_CERT_AUX *aux = aux_get(x);
  if (aux->reject == nullptr) {
    aux->reject = sk_ASN1_OBJECT_new_null();
    if (aux->reject == nullptr) {
      return 0;
    }
  }
  return bssl::PushToStack(aux->reject, std::move(objtmp));
}